

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::joinTracks(MidiFile *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MidiEventList *pMVar4;
  reference ppMVar5;
  MidiEvent *event;
  int local_34;
  int oldTimeState;
  int j;
  int i;
  int length;
  int messagesum;
  MidiEventList *local_18;
  MidiEventList *joinedTrack;
  MidiFile *this_local;
  
  joinedTrack = (MidiEventList *)this;
  iVar1 = getTrackState(this);
  if (iVar1 != 1) {
    iVar1 = getNumTracks(this);
    if (iVar1 == 1) {
      this->m_theTrackState = 1;
    }
    else {
      pMVar4 = (MidiEventList *)operator_new(0x18);
      MidiEventList::MidiEventList(pMVar4);
      i = 0;
      local_18 = pMVar4;
      iVar1 = getNumTracks(this);
      for (oldTimeState = 0; oldTimeState < iVar1; oldTimeState = oldTimeState + 1) {
        ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,(long)oldTimeState);
        iVar2 = MidiEventList::size(*ppMVar5);
        i = iVar2 + i;
      }
      MidiEventList::reserve(local_18,(int)((double)i * 0.1 + (double)(i + 0x20)));
      iVar2 = getTickState(this);
      if (iVar2 == 0) {
        makeAbsoluteTicks(this);
      }
      for (oldTimeState = 0; oldTimeState < iVar1; oldTimeState = oldTimeState + 1) {
        local_34 = 0;
        while( true ) {
          ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)oldTimeState);
          iVar3 = MidiEventList::size(*ppMVar5);
          pMVar4 = local_18;
          if (iVar3 <= local_34) break;
          ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)oldTimeState);
          event = MidiEventList::operator[](*ppMVar5,local_34);
          MidiEventList::push_back_no_copy(pMVar4,event);
          local_34 = local_34 + 1;
        }
      }
      clear_no_deallocate(this);
      ppMVar5 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,0);
      pMVar4 = *ppMVar5;
      if (pMVar4 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(pMVar4);
        operator_delete(pMVar4);
      }
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                (&this->m_events,0);
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::push_back
                (&this->m_events,&local_18);
      sortTracks(this);
      if (iVar2 == 0) {
        makeDeltaTicks(this);
      }
      this->m_theTrackState = 1;
    }
  }
  return;
}

Assistant:

void MidiFile::joinTracks(void) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		return;
	}
	if (getNumTracks() == 1) {
		m_theTrackState = TRACK_STATE_JOINED;
		return;
	}

	MidiEventList* joinedTrack;
	joinedTrack = new MidiEventList;

	int messagesum = 0;
	int length = getNumTracks();
	int i, j;
	for (i=0; i<length; i++) {
		messagesum += (*m_events[i]).size();
	}
	joinedTrack->reserve((int)(messagesum + 32 + messagesum * 0.1));

	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}
	for (i=0; i<length; i++) {
		for (j=0; j<(int)m_events[i]->size(); j++) {
			joinedTrack->push_back_no_copy(&(*m_events[i])[j]);
		}
	}

	clear_no_deallocate();

	delete m_events[0];
	m_events.resize(0);
	m_events.push_back(joinedTrack);
	sortTracks();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_JOINED;
}